

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionVariable.cpp
# Opt level: O0

void __thiscall InductionVariable::ExpandInnerLoopChange(InductionVariable *this)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  int32 local_2c;
  int32 local_24;
  IntConstantBounds local_18;
  InductionVariable *local_10;
  InductionVariable *this_local;
  
  local_10 = this;
  bVar2 = IsValid(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InductionVariable.cpp"
                       ,0x95,"(IsValid())","IsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((this->isChangeDeterminate & 1U) != 0) {
    iVar3 = IntConstantBounds::LowerBound(&this->changeBounds);
    if (iVar3 < 0) {
      local_24 = -0x80000000;
    }
    else {
      local_24 = IntConstantBounds::LowerBound(&this->changeBounds);
    }
    iVar3 = IntConstantBounds::UpperBound(&this->changeBounds);
    if (iVar3 < 1) {
      local_2c = IntConstantBounds::UpperBound(&this->changeBounds);
    }
    else {
      local_2c = 0x7fffffff;
    }
    IntConstantBounds::IntConstantBounds(&local_18,local_24,local_2c);
    this->changeBounds = local_18;
  }
  return;
}

Assistant:

void InductionVariable::ExpandInnerLoopChange()
{
    Assert(IsValid());

    if(!isChangeDeterminate)
        return;

    changeBounds =
        IntConstantBounds(
            changeBounds.LowerBound() < 0 ? IntConstMin : changeBounds.LowerBound(),
            changeBounds.UpperBound() > 0 ? IntConstMax : changeBounds.UpperBound());
}